

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O2

Own<kj::Directory> __thiscall kj::newInMemoryDirectory(kj *this,Clock *clock)

{
  Directory *extraout_RDX;
  Own<kj::Directory> OVar1;
  Own<kj::(anonymous_namespace)::InMemoryDirectory> local_28;
  
  atomicRefcounted<kj::(anonymous_namespace)::InMemoryDirectory,kj::Clock_const&>
            ((kj *)&local_28,clock);
  *(Disposer **)this = local_28.disposer;
  *(InMemoryDirectory **)(this + 8) = local_28.ptr;
  local_28.ptr = (InMemoryDirectory *)0x0;
  Own<kj::(anonymous_namespace)::InMemoryDirectory>::~Own(&local_28);
  OVar1.ptr = extraout_RDX;
  OVar1.disposer = (Disposer *)this;
  return OVar1;
}

Assistant:

Own<Directory> newInMemoryDirectory(const Clock& clock) {
  return atomicRefcounted<InMemoryDirectory>(clock);
}